

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.hpp
# Opt level: O2

void __thiscall
helics::EndpointInfo::EndpointInfo
          (EndpointInfo *this,GlobalHandle handle,string_view key_,string_view type_)

{
  allocator<char> local_41;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  local_30._M_str = key_._M_str;
  local_30._M_len = key_._M_len;
  local_40._M_str = type_._M_str;
  local_40._M_len = type_._M_len;
  this->id = handle;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->key,&local_30,&local_41);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->type,&local_40,&local_41);
  gmlc::libguarded::
  shared_guarded<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
  ::shared_guarded<>(&this->message_queue);
  (this->mAvailableMessages).super___atomic_base<int>._M_i = 0;
  (this->sourceInformation).
  super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sourceInformation).
  super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sourceInformation).
  super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->targetInformation).
  super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->targetInformation).
  super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->targetInformation).
  super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->targets).
  super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->targets).
  super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->targets).
  super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sourceTargets)._M_dataplus._M_p = (pointer)&(this->sourceTargets).field_2;
  (this->sourceTargets)._M_string_length = 0;
  (this->sourceTargets).field_2._M_local_buf[0] = '\0';
  (this->destinationTargets)._M_dataplus._M_p = (pointer)&(this->destinationTargets).field_2;
  (this->destinationTargets)._M_string_length = 0;
  (this->destinationTargets).field_2._M_local_buf[0] = '\0';
  this->requiredConnections = 0;
  this->receiveOnly = false;
  this->hasFilter = false;
  this->required = false;
  this->targetedEndpoint = false;
  this->sourceOnly = false;
  return;
}

Assistant:

EndpointInfo(GlobalHandle handle, std::string_view key_, std::string_view type_):
        id(handle), key(key_), type(type_)
    {
    }